

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

ModuleData * FindModuleWithSourceLocation(ExpressionContext *ctx,char *position)

{
  bool bVar1;
  uint uVar2;
  ModuleData **ppMVar3;
  uint local_24;
  uint i;
  char *position_local;
  ExpressionContext *ctx_local;
  
  local_24 = 0;
  while( true ) {
    uVar2 = SmallArray<ModuleData_*,_128U>::size(&ctx->imports);
    if (uVar2 <= local_24) {
      return (ModuleData *)0x0;
    }
    ppMVar3 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,local_24);
    bVar1 = HasSourceCode((*ppMVar3)->bytecode,position);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  ppMVar3 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,local_24);
  return *ppMVar3;
}

Assistant:

ModuleData* FindModuleWithSourceLocation(ExpressionContext &ctx, const char *position)
{
	for(unsigned i = 0; i < ctx.imports.size(); i++)
	{
		if(HasSourceCode(ctx.imports[i]->bytecode, position))
			return ctx.imports[i];
	}

	return NULL;
}